

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heightmap.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  GLuint program;
  GLint GVar2;
  GLint GVar3;
  GLFWwindow *handle;
  float fVar4;
  double dVar5;
  GLuint shader_program;
  GLint uloc_project;
  GLint uloc_modelview;
  float f;
  int frame;
  double last_update_time;
  double dt;
  int iter;
  GLFWwindow *window;
  char **argv_local;
  int argc_local;
  
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  glfwWindowHint(0x20003,0);
  glfwWindowHint(0x22002,3);
  glfwWindowHint(0x22003,2);
  glfwWindowHint(0x22008,0x32001);
  glfwWindowHint(0x22006,1);
  handle = glfwCreateWindow(800,600,"GLFW OpenGL3 Heightmap demo",(GLFWmonitor *)0x0,
                            (GLFWwindow *)0x0);
  if (handle != (GLFWwindow *)0x0) {
    glfwSetKeyCallback(handle,key_callback);
    glfwMakeContextCurrent(handle);
    gladLoadGLLoader(glfwGetProcAddress);
    program = make_shader_program(vertex_shader_text,fragment_shader_text);
    if (program != 0) {
      (*glad_glUseProgram)(program);
      GVar2 = (*glad_glGetUniformLocation)(program,"project");
      GVar3 = (*glad_glGetUniformLocation)(program,"modelview");
      fVar4 = tanf(view_angle / 2.0);
      projection_matrix[5] = 1.0 / fVar4;
      projection_matrix[0] = projection_matrix[5] / aspect_ratio;
      projection_matrix[10] = (z_far + z_near) / (z_near - z_far);
      projection_matrix[0xb] = -1.0;
      projection_matrix[0xe] = (z_far * z_near * 2.0) / (z_near - z_far);
      (*glad_glUniformMatrix4fv)(GVar2,1,'\0',projection_matrix);
      modelview_matrix[0xc] = -5.0;
      modelview_matrix[0xd] = -5.0;
      modelview_matrix[0xe] = -20.0;
      (*glad_glUniformMatrix4fv)(GVar3,1,'\0',modelview_matrix);
      init_map();
      make_mesh(program);
      (*glad_glViewport)(0,0,800,600);
      (*glad_glClearColor)(0.0,0.0,0.0,0.0);
      dt._4_4_ = 0;
      _f = glfwGetTime();
      while (iVar1 = glfwWindowShouldClose(handle), iVar1 == 0) {
        (*glad_glClear)(0x4000);
        (*glad_glDrawElements)(1,0x9382,0x1405,(void *)0x0);
        glfwSwapBuffers(handle);
        glfwPollEvents();
        dVar5 = glfwGetTime();
        if ((0.2 < dVar5 - _f) && (_f = dVar5, dt._4_4_ < 200)) {
          update_map(1);
          update_mesh();
          dt._4_4_ = dt._4_4_ + 1;
        }
      }
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
    exit(1);
  }
  glfwTerminate();
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    GLFWwindow* window;
    int iter;
    double dt;
    double last_update_time;
    int frame;
    float f;
    GLint uloc_modelview;
    GLint uloc_project;

    GLuint shader_program;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_RESIZABLE, GL_FALSE);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 2);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);

    window = glfwCreateWindow(800, 600, "GLFW OpenGL3 Heightmap demo", NULL, NULL);
    if (! window )
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    /* Register events callback */
    glfwSetKeyCallback(window, key_callback);

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);

    /* Prepare opengl resources for rendering */
    shader_program = make_shader_program(vertex_shader_text, fragment_shader_text);

    if (shader_program == 0u)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glUseProgram(shader_program);
    uloc_project   = glGetUniformLocation(shader_program, "project");
    uloc_modelview = glGetUniformLocation(shader_program, "modelview");

    /* Compute the projection matrix */
    f = 1.0f / tanf(view_angle / 2.0f);
    projection_matrix[0]  = f / aspect_ratio;
    projection_matrix[5]  = f;
    projection_matrix[10] = (z_far + z_near)/ (z_near - z_far);
    projection_matrix[11] = -1.0f;
    projection_matrix[14] = 2.0f * (z_far * z_near) / (z_near - z_far);
    glUniformMatrix4fv(uloc_project, 1, GL_FALSE, projection_matrix);

    /* Set the camera position */
    modelview_matrix[12]  = -5.0f;
    modelview_matrix[13]  = -5.0f;
    modelview_matrix[14]  = -20.0f;
    glUniformMatrix4fv(uloc_modelview, 1, GL_FALSE, modelview_matrix);

    /* Create mesh data */
    init_map();
    make_mesh(shader_program);

    /* Create vao + vbo to store the mesh */
    /* Create the vbo to store all the information for the grid and the height */

    /* setup the scene ready for rendering */
    glViewport(0, 0, 800, 600);
    glClearColor(0.0f, 0.0f, 0.0f, 0.0f);

    /* main loop */
    frame = 0;
    iter = 0;
    last_update_time = glfwGetTime();

    while (!glfwWindowShouldClose(window))
    {
        ++frame;
        /* render the next frame */
        glClear(GL_COLOR_BUFFER_BIT);
        glDrawElements(GL_LINES, 2* MAP_NUM_LINES , GL_UNSIGNED_INT, 0);

        /* display and process events through callbacks */
        glfwSwapBuffers(window);
        glfwPollEvents();
        /* Check the frame rate and update the heightmap if needed */
        dt = glfwGetTime();
        if ((dt - last_update_time) > 0.2)
        {
            /* generate the next iteration of the heightmap */
            if (iter < MAX_ITER)
            {
                update_map(NUM_ITER_AT_A_TIME);
                update_mesh();
                iter += NUM_ITER_AT_A_TIME;
            }
            last_update_time = dt;
            frame = 0;
        }
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}